

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenWriteDisconnected(FdObserver *this)

{
  undefined8 *puVar1;
  long *plVar2;
  WeakFulfiller<void> *params;
  long in_RSI;
  UnixEventPort *local_38;
  
  params = (WeakFulfiller<void> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00629ab8;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00629af0;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_38,params);
  puVar1 = *(undefined8 **)(in_RSI + 0x40);
  plVar2 = *(long **)(in_RSI + 0x48);
  *(WeakFulfillerBase **)(in_RSI + 0x40) = &params->super_WeakFulfillerBase;
  *(WeakFulfiller<void> **)(in_RSI + 0x48) = params;
  if (plVar2 != (long *)0x0) {
    (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  this->eventPort = local_38;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenWriteDisconnected() {
  auto paf = newPromiseAndFulfiller<void>();
  hupFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}